

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubModel.cpp
# Opt level: O0

size_t __thiscall
iDynTree::SubModelDecomposition::getSubModelOfFrame
          (SubModelDecomposition *this,Model *model,FrameIndex *frame)

{
  LinkIndex *link;
  ostream *poVar1;
  long *in_RDX;
  LinkIndex linkOfFrame;
  size_t ret;
  FrameIndex in_stack_000001c0;
  Model *in_stack_000001c8;
  SubModelDecomposition *this_00;
  
  this_00 = (SubModelDecomposition *)0x0;
  link = (LinkIndex *)Model::getFrameLink(in_stack_000001c8,in_stack_000001c0);
  if (link == LINK_INVALID_INDEX) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "SubModelDecomposition error: requested frame index ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RDX);
    poVar1 = std::operator<<(poVar1,"outside bounds ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    this_00 = (SubModelDecomposition *)getSubModelOfLink(this_00,link);
  }
  return (size_t)this_00;
}

Assistant:

size_t SubModelDecomposition::getSubModelOfFrame(const Model & model, const FrameIndex& frame) const
{
    size_t ret = 0;
    LinkIndex linkOfFrame = model.getFrameLink(frame);

    if( linkOfFrame != LINK_INVALID_INDEX )
    {
        ret = this->getSubModelOfLink(linkOfFrame);
    }
    else
    {
        std::cerr << "SubModelDecomposition error: requested frame index " << frame
                  << "outside bounds " << std::endl;
    }

    return ret;
}